

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

int32 __thiscall rw::Camera::frustumTestSphere(Camera *this,Sphere *s)

{
  float32 fVar1;
  float fVar2;
  int local_34;
  float32 dist;
  int32 i;
  FrustumPlane *p;
  int32 res;
  Sphere *s_local;
  Camera *this_local;
  
  p._4_4_ = 2;
  _dist = (V3d *)this->frustumPlanes;
  local_34 = 0;
  while( true ) {
    if (5 < local_34) {
      return p._4_4_;
    }
    fVar1 = dot(_dist,&s->center);
    fVar2 = (float)fVar1 - (float)_dist[1].x;
    if ((float)s->radius < fVar2) break;
    if (-fVar2 < (float)s->radius) {
      p._4_4_ = 1;
    }
    _dist = (V3d *)&_dist[1].z;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

int32
Camera::frustumTestSphere(const Sphere *s) const
{
	int32 res = SPHEREINSIDE;
	const FrustumPlane *p = this->frustumPlanes;
	for(int32 i = 0; i < 6; i++){
		float32 dist = dot(p->plane.normal, s->center) - p->plane.distance;
		if(s->radius < dist)
			return SPHEREOUTSIDE;
		if(s->radius > -dist)
			res = SPHEREBOUNDARY;
		p++;
	}
	return res;
}